

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messaging.c
# Opt level: O0

void clean_up_messaging(void)

{
  int iVar1;
  __pid_t _Var2;
  int i;
  int local_4;
  
  for (local_4 = 0; local_4 < queue_count; local_4 = local_4 + 1) {
    iVar1 = queues[local_4].owner;
    _Var2 = getpid();
    if (iVar1 == _Var2) {
      cgreen_pipe_close(0);
      cgreen_pipe_close(0);
    }
  }
  free(queues);
  queues = (CgreenMessageQueue *)0x0;
  queue_count = 0;
  return;
}

Assistant:

static void clean_up_messaging(void) {
    int i;
    for (i = 0; i < queue_count; i++) {
        if (queues[i].owner == getpid()) {
            cgreen_pipe_close(queues[i].readpipe);
            cgreen_pipe_close(queues[i].writepipe);
        }
    }
    free(queues);
    queues = NULL;
    queue_count = 0;
}